

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O0

void __thiscall
xemmai::t_type_of<xemmai::t_module>::f_do_instantiate
          (t_type_of<xemmai::t_module> *this,t_pvalue *a_stack,size_t a_n)

{
  t_object *ptVar1;
  t_string *this_00;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar2;
  wstring_view wVar3;
  xemmai *local_30;
  size_t a_n_local;
  t_pvalue *a_stack_local;
  t_type_of<xemmai::t_module> *this_local;
  
  if (a_n != 1) {
    bVar2 = sv(L"must be called with an argument.",0x20);
    wVar3._M_str = bVar2._M_str;
    local_30 = (xemmai *)bVar2._M_len;
    wVar3._M_len = (size_t)wVar3._M_str;
    f_throw(local_30,wVar3);
  }
  ptVar1 = t_pointer::operator_cast_to_t_object_(&a_stack[2].super_t_pointer);
  f_check<xemmai::t_string>(ptVar1,L"argument0");
  ptVar1 = t_pointer::operator->(&a_stack[2].super_t_pointer);
  this_00 = t_object::f_as<xemmai::t_string>(ptVar1);
  wVar3 = t_string::operator_cast_to_basic_string_view(this_00);
  ptVar1 = t_module::f_instantiate(wVar3);
  t_pointer::operator=(&a_stack->super_t_pointer,ptVar1);
  return;
}

Assistant:

void t_type_of<t_module>::f_do_instantiate(t_pvalue* a_stack, size_t a_n)
{
	if (a_n != 1) f_throw(L"must be called with an argument."sv);
	f_check<t_string>(a_stack[2], L"argument0");
	a_stack[0] = t_module::f_instantiate(a_stack[2]->f_as<t_string>());
}